

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O0

LispPTR LCPutIVValue(LispPTR object,LispPTR iv,LispPTR val)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  LCIVCacheEntry *pLVar3;
  uint *puVar4;
  uint local_40;
  LispPTR local_3c;
  int i;
  LispPTR iNames;
  LCIVCacheEntry *ce;
  int index;
  LispPTR *valptr;
  LCInstance *objptr;
  LispPTR val_local;
  LispPTR iv_local;
  LispPTR object_local;
  
  if (atom_instance == 0) {
    LCinit();
  }
  if ((*(uint *)(DTDspace +
                (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 4) +
                (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 1)) &
      0xfffffff) == atom_instance) {
    pLVar2 = NativeAligned4FromLAddr(object);
    local_3c = pLVar2[1];
    pLVar3 = LCIVCache + ((local_3c ^ iv) & 0x3ff);
    if ((pLVar3->iNames == local_3c) && (pLVar3->iv == iv)) {
      ce._4_4_ = pLVar3->index & 0xffff;
LAB_0015058a:
      pLVar2 = NativeAligned4FromLAddr(pLVar2[2]);
      puVar4 = pLVar2 + (int)ce._4_4_;
      if ((*(uint *)(DTDspace +
                    (long)(int)((*(ushort *)((ulong)(MDStypetbl + (*puVar4 >> 9)) ^ 2) & 0x7ff) << 4
                               ) +
                    (long)(int)((*(ushort *)((ulong)(MDStypetbl + (*puVar4 >> 9)) ^ 2) & 0x7ff) << 1
                               )) & 0xfffffff) != atom_annotatedValue) {
        if (((*(ushort *)((ulong)(MDStypetbl + (val >> 9)) ^ 2) & 0x8000) == 0) &&
           (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(val,0);
          }
          else {
            htfind(val,0);
          }
        }
        if (((*(ushort *)((ulong)(MDStypetbl + (*puVar4 >> 9)) ^ 2) & 0x8000) == 0) &&
           (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(*puVar4,1);
          }
          else {
            htfind(*puVar4,1);
          }
        }
        *puVar4 = val;
        return val;
      }
    }
    else if ((*(ushort *)((ulong)(MDStypetbl + (local_3c >> 9)) ^ 2) & 0x7ff) == 5) {
      local_40 = 0;
      do {
        LVar1 = car(local_3c);
        if (LVar1 == iv) {
          pLVar3->iNames = pLVar2[1];
          pLVar3->iv = iv;
          pLVar3->index = local_40 | 0xe0000;
          ce._4_4_ = local_40;
          goto LAB_0015058a;
        }
        local_40 = local_40 + 1;
        local_3c = cdr(local_3c);
      } while (local_3c != 0);
    }
    iv_local = lcfuncall(atom_PutIVValue_LCUFN,3,3);
  }
  else {
    iv_local = lcfuncall(atom_PutIVValue_LCUFN,3,3);
  }
  return iv_local;
}

Assistant:

LispPTR LCPutIVValue(LispPTR object, LispPTR iv, LispPTR val) {
  struct LCInstance *objptr;
  LispPTR *valptr;
  int index;

  LC_INIT;
  INSTANCE_OR_PUNT(object, atom_PutIVValue_LCUFN, 3);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  GET_IV_INDEX(objptr, iv, index, goto pnut);
  valptr = &(((LispPTR *)NativeAligned4FromLAddr(objptr->iDescrs))[index]);
  if (!LC_TYPEP(*valptr, atom_annotatedValue)) {
    FRPLPTR((*valptr), val);
    return val;
  }
pnut:
  RETCALL(atom_PutIVValue_LCUFN, 3);
  /*
    return LCPutActiveValue(object,*valptr,val);
  */
}